

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

string * __thiscall
YAML::Tag::Translate_abi_cxx11_(string *__return_storage_ptr__,Tag *this,Directives *directives)

{
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string sStack_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  switch(this->type) {
  case VERBATIM:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->value);
    return __return_storage_ptr__;
  case PRIMARY_HANDLE:
    std::__cxx11::string::string((string *)&local_68,"!",(allocator *)&local_48);
    Directives::TranslateTagHandle(&sStack_88,directives,&local_68);
    std::operator+(__return_storage_ptr__,&sStack_88,&this->value);
    break;
  case SECONDARY_HANDLE:
    std::__cxx11::string::string((string *)&local_68,"!!",(allocator *)&local_48);
    Directives::TranslateTagHandle(&sStack_88,directives,&local_68);
    std::operator+(__return_storage_ptr__,&sStack_88,&this->value);
    break;
  case NAMED_HANDLE:
    std::operator+(&local_48,"!",&this->handle);
    std::operator+(&local_68,&local_48,"!");
    Directives::TranslateTagHandle(&sStack_88,directives,&local_68);
    std::operator+(__return_storage_ptr__,&sStack_88,&this->value);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::__cxx11::string::~string((string *)&local_68);
    this_01 = &local_48;
    goto LAB_006ad511;
  case NON_SPECIFIC:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"!",(allocator *)&sStack_88);
    return __return_storage_ptr__;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"yaml-cpp: internal error, bad tag type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)&sStack_88);
  this_01 = &local_68;
LAB_006ad511:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

const std::string Tag::Translate(const Directives& directives) {
  switch (type) {
    case VERBATIM:
      return value;
    case PRIMARY_HANDLE:
      return directives.TranslateTagHandle("!") + value;
    case SECONDARY_HANDLE:
      return directives.TranslateTagHandle("!!") + value;
    case NAMED_HANDLE:
      return directives.TranslateTagHandle("!" + handle + "!") + value;
    case NON_SPECIFIC:
      // TODO:
      return "!";
    default:
      assert(false);
  }
  throw std::runtime_error("yaml-cpp: internal error, bad tag type");
}